

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O2

bool kratos::is_valid_verilog(string *src)

{
  int iVar1;
  runtime_error *prVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_string_view<char> bVar3;
  string_view format_str;
  string_view format_str_00;
  format_args args;
  format_args args_00;
  undefined1 local_308 [8];
  ofstream f;
  undefined1 local_108 [8];
  string pathname;
  string verilator;
  string output_filename;
  undefined1 auStack_88 [8];
  string filename;
  string iverilog;
  
  fs::temp_directory_path_abi_cxx11_();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_308,"src.sv",(allocator<char> *)(iverilog.field_2._M_local_buf + 8));
  fs::join((string *)auStack_88,(string *)local_108,(string *)local_308);
  std::__cxx11::string::~string((string *)local_308);
  if (filename._M_dataplus._M_p == (pointer)0x0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"unable to create temp file");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::ofstream::ofstream(local_308,(string *)auStack_88,_S_out);
  std::operator<<((ostream *)local_308,(string *)src);
  std::ofstream::close();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(iverilog.field_2._M_local_buf + 8),"verilator",
             (allocator<char> *)(filename.field_2._M_local_buf + 8));
  fs::which((string *)((long)&pathname.field_2 + 8),(string *)((long)&iverilog.field_2 + 8));
  std::__cxx11::string::~string((string *)(iverilog.field_2._M_local_buf + 8));
  if (verilator._M_dataplus._M_p == (pointer)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(iverilog.field_2._M_local_buf + 8),"iverilog",
               (allocator<char> *)(verilator.field_2._M_local_buf + 8));
    fs::which((string *)((long)&filename.field_2 + 8),(string *)((long)&iverilog.field_2 + 8));
    std::__cxx11::string::~string((string *)(iverilog.field_2._M_local_buf + 8));
    if (iverilog._M_dataplus._M_p == (pointer)0x0) {
      fs::remove(auStack_88);
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar2,"iverilog and verilator not found in the system");
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(iverilog.field_2._M_local_buf + 8),"out.a",
               (allocator<char> *)(output_filename.field_2._M_local_buf + 8));
    fs::join((string *)((long)&verilator.field_2 + 8),(string *)local_108,
             (string *)((long)&iverilog.field_2 + 8));
    std::__cxx11::string::~string((string *)(iverilog.field_2._M_local_buf + 8));
    iverilog.field_2._8_8_ = filename.field_2._8_8_;
    bVar3 = fmt::v7::to_string_view<char,_0>("{0} {1} -o {2}");
    format_str_00.data_ = (char *)bVar3.size_;
    format_str_00.size_ = 0xddd;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)((long)&iverilog.field_2 + 8);
    fmt::v7::detail::vformat_abi_cxx11_
              ((string *)((long)&output_filename.field_2 + 8),(detail *)bVar3.data_,format_str_00,
               args_00);
    iVar1 = system((char *)output_filename.field_2._8_8_);
    std::__cxx11::string::~string((string *)(output_filename.field_2._M_local_buf + 8));
    fs::remove(auStack_88);
    std::__cxx11::string::~string((string *)(verilator.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(filename.field_2._M_local_buf + 8));
  }
  else {
    iverilog.field_2._8_8_ = pathname.field_2._8_8_;
    bVar3 = fmt::v7::to_string_view<char,_0>("{0} {1} --lint-only -Wno-fatal");
    format_str.data_ = (char *)bVar3.size_;
    format_str.size_ = 0xdd;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)((long)&iverilog.field_2 + 8);
    fmt::v7::detail::vformat_abi_cxx11_
              ((string *)((long)&filename.field_2 + 8),(detail *)bVar3.data_,format_str,args);
    iVar1 = system((char *)filename.field_2._8_8_);
    std::__cxx11::string::~string((string *)(filename.field_2._M_local_buf + 8));
    fs::remove(auStack_88);
  }
  std::__cxx11::string::~string((string *)(pathname.field_2._M_local_buf + 8));
  std::ofstream::~ofstream(local_308);
  std::__cxx11::string::~string((string *)auStack_88);
  std::__cxx11::string::~string((string *)local_108);
  return iVar1 == 0;
}

Assistant:

bool is_valid_verilog(const std::string &src) {
    // we first output to a temp src
    std::string pathname = fs::temp_directory_path();
    std::string filename = fs::join(pathname, "src.sv");
    if (filename.empty()) throw std::runtime_error("unable to create temp file");
    std::ofstream f(filename);
    f << src;
    f.close();

    int status;

    // choose which parser to use
    // we use verilator first
    std::string verilator = fs::which("verilator");
    if (!verilator.empty()) {
        status =
            std::system(::format("{0} {1} --lint-only -Wno-fatal", verilator, filename).c_str());
        fs::remove(filename);
        return status == 0;
    }

    std::string iverilog = fs::which("iverilog");
    if (!iverilog.empty()) {
        std::string output_filename = fs::join(pathname, "out.a");
        status =
            std::system(::format("{0} {1} -o {2}", iverilog, filename, output_filename).c_str());
        fs::remove(filename);
        return status == 0;
    }

    fs::remove(filename);
    throw std::runtime_error("iverilog and verilator not found in the system");
}